

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O1

int Agi_ManSuppSize_rec(Agi_Man_t *p,int i)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)i;
  iVar4 = 0;
  iVar3 = 0;
  do {
    iVar5 = (int)uVar6;
    if (p->pTravIds[iVar5] == p->nTravIds) {
LAB_00672beb:
      return iVar3 + iVar4;
    }
    p->pTravIds[iVar5] = p->nTravIds;
    uVar6 = p->pObjs[iVar5];
    uVar1 = (uint)(uVar6 >> 0x20);
    if (0x7ffffffe < uVar1 >> 1) {
      iVar4 = 1;
      goto LAB_00672beb;
    }
    if ((0xfffffffbfffffff9 < uVar6) || (uVar1 <= (uint)uVar6)) {
      __assert_fail("Agi_ObjIsAnd(p, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAgi.c"
                    ,0xcb,"int Agi_ManSuppSize_rec(Agi_Man_t *, int)");
    }
    iVar2 = Agi_ManSuppSize_rec(p,(uint)uVar6 >> 1);
    uVar6 = p->pObjs[iVar5] >> 0x21;
    iVar3 = iVar3 + iVar2;
  } while( true );
}

Assistant:

int Agi_ManSuppSize_rec( Agi_Man_t * p, int i )
{
    if ( p->pTravIds[i] == p->nTravIds )
        return 0;
    p->pTravIds[i] = p->nTravIds;
    if ( Agi_ObjIsCi(p, i) )
        return 1;
    assert( Agi_ObjIsAnd(p, i) );
    return Agi_ManSuppSize_rec( p, Agi_ObjVar0(p, i) ) +  Agi_ManSuppSize_rec( p, Agi_ObjVar1(p, i) );
}